

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void QPDF::compute_encryption_O_U
               (char *user_password,char *owner_password,int V,int R,int key_len,int P,
               bool encrypt_metadata,string *id1,string *O,string *U)

{
  int iterations;
  unsigned_long max_len;
  uchar *data_00;
  logic_error *this;
  allocator<char> local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  int local_1e0;
  int local_1dc;
  char upass [32];
  undefined1 local_1b8 [8];
  string k1;
  uchar O_key [16];
  undefined1 local_178 [8];
  string local_170;
  string local_150;
  char *local_130;
  string local_128;
  EncryptionData data;
  
  local_1e0 = P;
  local_130 = owner_password;
  if (V < 5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)upass,"",(allocator<char> *)O_key);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&k1,"",(allocator<char> *)&local_1dc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_1e2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_1e3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_1e1);
    EncryptionData::EncryptionData
              (&data,V,R,key_len,local_1e0,(string *)upass,&k1,&local_150,&local_170,&local_128,id1,
               encrypt_metadata);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&k1);
    std::__cxx11::string::~string((string *)upass);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,user_password,&local_1e2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,local_130,&local_1e3);
    compute_O_rc4_key(&local_170,&local_128,&data,O_key);
    if (0x1f < local_170._M_string_length) {
      local_170._M_string_length = 0x20;
    }
    memcpy(upass,local_170._M_dataplus._M_p,local_170._M_string_length);
    memcpy(upass + local_170._M_string_length,padding_string,0x20 - local_170._M_string_length);
    k1._M_dataplus._M_p = (pointer)&k1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&k1,O_key,local_178);
    local_1dc = data.Length_bytes;
    max_len = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&local_1dc);
    pad_short_parameter(&k1,max_len);
    data_00 = QUtil::unsigned_char_pointer(upass);
    iterations = 1;
    if (2 < data.R) {
      iterations = 0x14;
    }
    iterate_rc4(data_00,0x20,O_key,data.Length_bytes,iterations,false);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,upass,local_1b8);
    std::__cxx11::string::~string((string *)&k1);
    std::__cxx11::string::_M_assign((string *)&data.O);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::_M_assign((string *)O);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&k1,user_password,(allocator<char> *)&local_150);
    compute_U_value((string *)upass,&k1,&data);
    std::__cxx11::string::_M_assign((string *)&data.U);
    std::__cxx11::string::~string((string *)upass);
    std::__cxx11::string::~string((string *)&k1);
    std::__cxx11::string::_M_assign((string *)U);
    EncryptionData::~EncryptionData(&data);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"compute_encryption_O_U called for file with V >= 5");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDF::compute_encryption_O_U(
    char const* user_password,
    char const* owner_password,
    int V,
    int R,
    int key_len,
    int P,
    bool encrypt_metadata,
    std::string const& id1,
    std::string& O,
    std::string& U)
{
    if (V >= 5) {
        throw std::logic_error("compute_encryption_O_U called for file with V >= 5");
    }
    EncryptionData data(V, R, key_len, P, "", "", "", "", "", id1, encrypt_metadata);
    data.setO(compute_O_value(user_password, owner_password, data));
    O = data.getO();
    data.setU(compute_U_value(user_password, data));
    U = data.getU();
}